

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_clock.c
# Opt level: O1

int nni_time_get(uint64_t *sec,uint32_t *nsec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined1 local_30 [8];
  timespec ts;
  
  iVar2 = 0;
  iVar1 = clock_gettime(0,(timespec *)local_30);
  if (iVar1 == 0) {
    *sec = (uint64_t)local_30;
    *nsec = (uint32_t)ts.tv_sec;
  }
  else {
    piVar3 = __errno_location();
    iVar2 = nni_plat_errno(*piVar3);
  }
  return iVar2;
}

Assistant:

int
nni_time_get(uint64_t *sec, uint32_t *nsec)
{
	int rv;
#if defined(NNG_HAVE_TIMESPEC_GET)
	struct timespec ts;
	if ((rv = timespec_get(&ts, TIME_UTC)) == TIME_UTC) {
		*sec  = ts.tv_sec;
		*nsec = ts.tv_nsec;
		return (0);
	}
#elif defined(NNG_HAVE_CLOCK_GETTIME)
	struct timespec ts;
	if ((rv = clock_gettime(CLOCK_REALTIME, &ts)) == 0) {
		*sec  = ts.tv_sec;
		*nsec = ts.tv_nsec;
		return (0);
	}
#else
	struct timeval tv;
	if ((rv = gettimeofday(&tv, NULL)) == 0) {
		*sec  = tv.tv_sec;
		*nsec = tv.tv_usec * 1000;
		return (0);
	}
#endif
	return (nni_plat_errno(errno));
}